

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

EffectiveSign __thiscall
slang::ast::Expression::getEffectiveSign(Expression *this,bool isForConversion)

{
  EffectiveSign EVar1;
  undefined3 in_register_00000031;
  
  EVar1 = (*(code *)(&DAT_00467e70 + *(int *)(&DAT_00467e70 + (ulong)this->kind * 4)))
                    (this,CONCAT31(in_register_00000031,isForConversion));
  return EVar1;
}

Assistant:

Expression::EffectiveSign Expression::getEffectiveSign(bool isForConversion) const {
    EffectiveSignVisitor visitor(isForConversion);
    return visit(visitor);
}